

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void WebPCopyPixels(WebPPicture *src,WebPPicture *dst)

{
  uint8_t *in_RSI;
  undefined8 in_RDI;
  uint8_t *unaff_retaddr;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  WebPCopyPlane(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),in_RSI,in_stack_ffffffffffffffec,
                in_stack_ffffffffffffffe8,0);
  return;
}

Assistant:

void WebPCopyPixels(const WebPPicture* const src, WebPPicture* const dst) {
  assert(src != NULL && dst != NULL);
  assert(src->width == dst->width && src->height == dst->height);
  assert(src->use_argb && dst->use_argb);
  WebPCopyPlane((uint8_t*)src->argb, 4 * src->argb_stride, (uint8_t*)dst->argb,
                4 * dst->argb_stride, 4 * src->width, src->height);
}